

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O2

IOStream * __thiscall Assimp::FileSystemFilter::Open(FileSystemFilter *this,char *pFile,char *pMode)

{
  IOSystem *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator local_61;
  undefined8 local_60 [4];
  string tmp;
  IOStream *pIVar3;
  
  pIVar1 = this->mWrapped;
  if (pIVar1 != (IOSystem *)0x0) {
    if (pMode == (char *)0x0 || pFile == (char *)0x0) {
      pIVar3 = (IOStream *)0x0;
    }
    else {
      iVar2 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,pFile,pMode);
      pIVar3 = (IOStream *)CONCAT44(extraout_var,iVar2);
      if (pIVar3 == (IOStream *)0x0) {
        std::__cxx11::string::string((string *)&tmp,pFile,(allocator *)local_60);
        BuildPath(this,&tmp);
        pIVar1 = this->mWrapped;
        std::__cxx11::string::string((string *)local_60,pMode,&local_61);
        iVar2 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,tmp._M_dataplus._M_p,local_60[0]);
        pIVar3 = (IOStream *)CONCAT44(extraout_var_00,iVar2);
        std::__cxx11::string::~string((string *)local_60);
        if (pIVar3 == (IOStream *)0x0) {
          std::__cxx11::string::assign((char *)&tmp);
          Cleanup(this,&tmp);
          BuildPath(this,&tmp);
          pIVar1 = this->mWrapped;
          std::__cxx11::string::string((string *)local_60,pMode,&local_61);
          iVar2 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,tmp._M_dataplus._M_p,local_60[0]);
          pIVar3 = (IOStream *)CONCAT44(extraout_var_01,iVar2);
          std::__cxx11::string::~string((string *)local_60);
        }
        std::__cxx11::string::~string((string *)&tmp);
      }
    }
    return pIVar3;
  }
  __assert_fail("nullptr != mWrapped",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/FileSystemFilter.h"
                ,0x7d,"virtual IOStream *Assimp::FileSystemFilter::Open(const char *, const char *)"
               );
}

Assistant:

IOStream* Open( const char* pFile, const char* pMode = "rb") {
        ai_assert( nullptr != mWrapped );
        if ( nullptr == pFile || nullptr == pMode ) {
            return nullptr;
        }
        
        ai_assert( nullptr != pFile );
        ai_assert( nullptr != pMode );

        // First try the unchanged path
        IOStream* s = mWrapped->Open(pFile,pMode);

        if (nullptr == s) {
            std::string tmp = pFile;

            // Try to convert between absolute and relative paths
            BuildPath(tmp);
            s = mWrapped->Open(tmp,pMode);

            if (nullptr == s) {
                // Finally, look for typical issues with paths
                // and try to correct them. This is our last
                // resort.
                tmp = pFile;
                Cleanup(tmp);
                BuildPath(tmp);
                s = mWrapped->Open(tmp,pMode);
            }
        }

        return s;
    }